

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_benchmark.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> *
anon_unknown.dwarf_b963::read_modern_mmap_range_prealloc
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          char *file_name)

{
  mmap_file file;
  char *file_name_local;
  path local_38;
  
  file_name_local = file_name;
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (&local_38,&file_name_local,auto_format);
  io::posix::mmap_file::mmap_file(&file,&local_38,read_only,owner_read|owner_write);
  std::filesystem::__cxx11::path::~path(&local_38);
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (__return_storage_ptr__,file.mmap_.size_);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((uchar *)file.mmap_.addr_,(uchar *)(file.mmap_.size_ + (long)file.mmap_.addr_),
             (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)
             __return_storage_ptr__);
  io::posix::detail::mmap_handle::~mmap_handle(&file.mmap_);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::uint8_t> read_modern_mmap_range_prealloc(const char* file_name)
{
    auto file = io::posix::mmap_file{file_name, io::open_mode::read_only};
    std::vector<std::uint8_t> output;
    output.reserve(file.size());
    std::copy(std::begin(file), std::end(file), std::back_inserter(output));
    return output;
}